

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

PClassActor * __thiscall ADehackedPickup::DetermineType(ADehackedPickup *this)

{
  uint uVar1;
  PClassActor *pPVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  iVar5 = 0x23;
  iVar6 = 0;
  uVar3 = sprites.Array[(this->super_AInventory).super_AActor.sprite].field_0.dwName;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  do {
    iVar4 = (iVar6 + iVar5) / 2;
    uVar1 = *(uint *)DehSpriteMappings[iVar4].Sprite;
    uVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (uint)(uVar7 < uVar3);
    uVar7 = (uint)(uVar7 >= uVar3 && uVar7 != uVar3);
    if (uVar7 == uVar1) {
      pPVar2 = PClass::FindActor(DehSpriteMappings[iVar4].ClassName);
      return pPVar2;
    }
    if ((int)(uVar7 - uVar1) < 0) {
      iVar6 = iVar4 + 1;
    }
    else {
      iVar5 = iVar4 + -1;
    }
  } while (iVar6 <= iVar5);
  return (PClassActor *)0x0;
}

Assistant:

PClassActor *ADehackedPickup::DetermineType ()
{
	// Look at the actor's current sprite to determine what kind of
	// item to pretend to me.
	int min = 0;
	int max = countof(DehSpriteMappings) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lex = memcmp (DehSpriteMappings[mid].Sprite, sprites[sprite].name, 4);
		if (lex == 0)
		{
			return PClass::FindActor(DehSpriteMappings[mid].ClassName);
		}
		else if (lex < 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}